

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O0

Vec_Int_t * Bac_NtkDfs(Bac_Ntk_t *p)

{
  int iVar1;
  Vec_Int_t *vBoxes_00;
  Vec_Int_t *vBoxes;
  int iObj;
  int i;
  Bac_Ntk_t *p_local;
  
  iVar1 = Bac_NtkBoxNum(p);
  vBoxes_00 = Vec_IntAlloc(iVar1);
  Bac_NtkStartCopies(p);
  for (vBoxes._4_4_ = 0; iVar1 = Bac_NtkPiNum(p), vBoxes._4_4_ < iVar1;
      vBoxes._4_4_ = vBoxes._4_4_ + 1) {
    iVar1 = Bac_NtkPi(p,vBoxes._4_4_);
    Bac_ObjSetCopy(p,iVar1,1);
  }
  for (vBoxes._4_4_ = 0; iVar1 = Bac_NtkPoNum(p), vBoxes._4_4_ < iVar1;
      vBoxes._4_4_ = vBoxes._4_4_ + 1) {
    iVar1 = Bac_NtkPo(p,vBoxes._4_4_);
    iVar1 = Bac_ObjFanin(p,iVar1);
    Bac_NtkDfs_rec(p,iVar1,vBoxes_00);
  }
  return vBoxes_00;
}

Assistant:

Vec_Int_t * Bac_NtkDfs( Bac_Ntk_t * p )
{
    int i, iObj;
    Vec_Int_t * vBoxes = Vec_IntAlloc( Bac_NtkBoxNum(p) );
    Bac_NtkStartCopies( p ); // -1 = not visited; 1 = finished
    Bac_NtkForEachPi( p, iObj, i )
        Bac_ObjSetCopy( p, iObj, 1 );
    Bac_NtkForEachPo( p, iObj, i )
        Bac_NtkDfs_rec( p, Bac_ObjFanin(p, iObj), vBoxes );
    return vBoxes;
}